

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode resolve_server(SessionHandle *data,connectdata *conn,_Bool *async)

{
  Curl_dns_entry *local_40;
  Curl_dns_entry *hostaddr;
  long lStack_30;
  int rc;
  long timeout_ms;
  _Bool *p_Stack_20;
  CURLcode result;
  _Bool *async_local;
  connectdata *conn_local;
  SessionHandle *data_local;
  
  timeout_ms._4_4_ = CURLE_OK;
  p_Stack_20 = async;
  async_local = (_Bool *)conn;
  conn_local = (connectdata *)data;
  lStack_30 = Curl_timeleft(data,(timeval *)0x0,true);
  if ((async_local[0x289] & 1U) == 0) {
    fix_hostname((SessionHandle *)conn_local,(connectdata *)async_local,
                 (hostname *)(async_local + 0xb0));
    if ((*(long *)(async_local + 0xe0) == 0) || (**(char **)(async_local + 0xe0) == '\0')) {
      *(long *)(async_local + 0xf0) = (long)*(int *)(async_local + 0xf8);
      hostaddr._4_4_ =
           Curl_resolv_timeout((connectdata *)async_local,*(char **)(async_local + 0xc0),
                               (int)*(undefined8 *)(async_local + 0xf0),&local_40,lStack_30);
      if (hostaddr._4_4_ == 1) {
        *p_Stack_20 = true;
      }
      else if (hostaddr._4_4_ == -2) {
        timeout_ms._4_4_ = CURLE_OPERATION_TIMEDOUT;
      }
      else if (local_40 == (Curl_dns_entry *)0x0) {
        Curl_failf((SessionHandle *)conn_local,"Couldn\'t resolve host \'%s\'",
                   *(undefined8 *)(async_local + 200));
        timeout_ms._4_4_ = CURLE_COULDNT_RESOLVE_HOST;
      }
    }
    else {
      fix_hostname((SessionHandle *)conn_local,(connectdata *)async_local,
                   (hostname *)(async_local + 0xd0));
      hostaddr._4_4_ =
           Curl_resolv_timeout((connectdata *)async_local,*(char **)(async_local + 0xe0),
                               (int)*(undefined8 *)(async_local + 0xf0),&local_40,lStack_30);
      if (hostaddr._4_4_ == 1) {
        *p_Stack_20 = true;
      }
      else if (hostaddr._4_4_ == -2) {
        timeout_ms._4_4_ = CURLE_OPERATION_TIMEDOUT;
      }
      else if (local_40 == (Curl_dns_entry *)0x0) {
        Curl_failf((SessionHandle *)conn_local,"Couldn\'t resolve proxy \'%s\'",
                   *(undefined8 *)(async_local + 0xe8));
        timeout_ms._4_4_ = CURLE_COULDNT_RESOLVE_PROXY;
      }
    }
    *(Curl_dns_entry **)(async_local + 0x58) = local_40;
  }
  else {
    *p_Stack_20 = false;
  }
  return timeout_ms._4_4_;
}

Assistant:

static CURLcode resolve_server(struct SessionHandle *data,
                               struct connectdata *conn,
                               bool *async)
{
  CURLcode result=CURLE_OK;
  long timeout_ms = Curl_timeleft(data, NULL, TRUE);

  /*************************************************************
   * Resolve the name of the server or proxy
   *************************************************************/
  if(conn->bits.reuse)
    /* We're reusing the connection - no need to resolve anything, and
       fix_hostname() was called already in create_conn() for the re-use
       case. */
    *async = FALSE;

  else {
    /* this is a fresh connect */
    int rc;
    struct Curl_dns_entry *hostaddr;

    /* set a pointer to the hostname we display */
    fix_hostname(data, conn, &conn->host);

#ifdef USE_UNIX_SOCKETS
    if(data->set.str[STRING_UNIX_SOCKET_PATH]) {
      /* Unix domain sockets are local. The host gets ignored, just use the
       * specified domain socket address. Do not cache "DNS entries". There is
       * no DNS involved and we already have the filesystem path available */
      const char *path = data->set.str[STRING_UNIX_SOCKET_PATH];

      hostaddr = calloc(1, sizeof(struct Curl_dns_entry));
      if(!hostaddr)
        result = CURLE_OUT_OF_MEMORY;
      else if((hostaddr->addr = Curl_unix2addr(path)) != NULL)
        hostaddr->inuse++;
      else {
        /* Long paths are not supported for now */
        if(strlen(path) >= sizeof(((struct sockaddr_un *)0)->sun_path)) {
          failf(data, "Unix socket path too long: '%s'", path);
          result = CURLE_COULDNT_RESOLVE_HOST;
        }
        else
          result = CURLE_OUT_OF_MEMORY;
        free(hostaddr);
        hostaddr = NULL;
      }
    }
    else
#endif
    if(!conn->proxy.name || !*conn->proxy.name) {
      /* If not connecting via a proxy, extract the port from the URL, if it is
       * there, thus overriding any defaults that might have been set above. */
      conn->port =  conn->remote_port; /* it is the same port */

      /* Resolve target host right on */
      rc = Curl_resolv_timeout(conn, conn->host.name, (int)conn->port,
                               &hostaddr, timeout_ms);
      if(rc == CURLRESOLV_PENDING)
        *async = TRUE;

      else if(rc == CURLRESOLV_TIMEDOUT)
        result = CURLE_OPERATION_TIMEDOUT;

      else if(!hostaddr) {
        failf(data, "Couldn't resolve host '%s'", conn->host.dispname);
        result =  CURLE_COULDNT_RESOLVE_HOST;
        /* don't return yet, we need to clean up the timeout first */
      }
    }
    else {
      /* This is a proxy that hasn't been resolved yet. */

      /* IDN-fix the proxy name */
      fix_hostname(data, conn, &conn->proxy);

      /* resolve proxy */
      rc = Curl_resolv_timeout(conn, conn->proxy.name, (int)conn->port,
                               &hostaddr, timeout_ms);

      if(rc == CURLRESOLV_PENDING)
        *async = TRUE;

      else if(rc == CURLRESOLV_TIMEDOUT)
        result = CURLE_OPERATION_TIMEDOUT;

      else if(!hostaddr) {
        failf(data, "Couldn't resolve proxy '%s'", conn->proxy.dispname);
        result = CURLE_COULDNT_RESOLVE_PROXY;
        /* don't return yet, we need to clean up the timeout first */
      }
    }
    DEBUGASSERT(conn->dns_entry == NULL);
    conn->dns_entry = hostaddr;
  }

  return result;
}